

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_decompressStream_simpleArgs
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,size_t *dstPos,void *src,
                 size_t srcSize,size_t *srcPos)

{
  size_t sVar1;
  ZSTD_outBuffer output;
  ZSTD_inBuffer local_50;
  ZSTD_outBuffer local_38;
  
  local_38.pos = *dstPos;
  local_50.pos = *srcPos;
  local_50.src = src;
  local_50.size = srcSize;
  local_38.dst = dst;
  local_38.size = dstCapacity;
  sVar1 = ZSTD_decompressStream(dctx,&local_38,&local_50);
  *dstPos = local_38.pos;
  *srcPos = local_50.pos;
  return sVar1;
}

Assistant:

size_t ZSTD_decompressStream_simpleArgs (
                            ZSTD_DCtx* dctx,
                            void* dst, size_t dstCapacity, size_t* dstPos,
                      const void* src, size_t srcSize, size_t* srcPos)
{
    ZSTD_outBuffer output;
    ZSTD_inBuffer  input;
    output.dst = dst;
    output.size = dstCapacity;
    output.pos = *dstPos;
    input.src = src;
    input.size = srcSize;
    input.pos = *srcPos;
    {   size_t const cErr = ZSTD_decompressStream(dctx, &output, &input);
        *dstPos = output.pos;
        *srcPos = input.pos;
        return cErr;
    }
}